

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

self * __thiscall
boost::python::
class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
::add_property<long_timestamp_t::*>
          (class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,offset_in_timestamp_t_to_long fget,char *docstr)

{
  object_base oStack_28;
  
  make_getter<long_timestamp_t::*>
            ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)&oStack_28,(offset_in_timestamp_t_to_long)this);
  objects::class_base::add_property(&this->super_class_base,name,(object *)&oStack_28,docstr);
  api::object_base::~object_base(&oStack_28);
  return this;
}

Assistant:

self& add_property(char const* name, Get fget, char const* docstr = 0)
    {
        base::add_property(name, this->make_getter(fget), docstr);
        return *this;
    }